

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O2

bool __thiscall Func::DoGlobOpt(Func *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  BOOL BVar4;
  JITTimeFunctionBody *this_00;
  
  uVar2 = GetSourceContextId(this);
  uVar3 = GetLocalFunctionId(this);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,GlobOptPhase,uVar2,uVar3);
  if ((((!bVar1) && (bVar1 = IsSimpleJit(this), !bVar1)) &&
      ((BVar4 = HasTry(this->topFunc), BVar4 == 0 ||
       (bVar1 = CanOptimizeTryCatch(this->topFunc), bVar1)))) &&
     ((bVar1 = HasFinally(this->topFunc), !bVar1 ||
      (bVar1 = CanOptimizeTryFinally(this->topFunc), bVar1)))) {
    this_00 = GetJITFunctionBody(this->topFunc);
    bVar1 = JITTimeFunctionBody::IsCoroutine(this_00);
    if (!bVar1) {
      return true;
    }
    uVar2 = GetSourceContextId(this);
    uVar3 = GetLocalFunctionId(this);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,GeneratorGlobOptPhase,uVar2,uVar3);
    return !bVar1;
  }
  return false;
}

Assistant:

bool DoGlobOpt() const
    {
        return
            !PHASE_OFF(Js::GlobOptPhase, this) && !IsSimpleJit() &&
            (!GetTopFunc()->HasTry() || GetTopFunc()->CanOptimizeTryCatch()) &&
            (!GetTopFunc()->HasFinally() || GetTopFunc()->CanOptimizeTryFinally()) &&
            (!GetTopFunc()->GetJITFunctionBody()->IsCoroutine() || !PHASE_OFF(Js::GeneratorGlobOptPhase, this));
    }